

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo_parallel1.cpp
# Opt level: O2

void anon_unknown.dwarf_dc463::cross_off
               (BitSieve *sieve,int64_t low,int64_t high,int64_t prime,WheelItem *w)

{
  long lVar1;
  char cVar2;
  int8_t *piVar3;
  long lVar4;
  
  piVar3 = &w->wheel_index;
  for (lVar4 = w->next_multiple; cVar2 = *piVar3, lVar4 < high;
      lVar4 = lVar4 + (char)primesum::Wheel::next[lVar1] * prime) {
    primesum::BitSieve::unset(sieve,lVar4 - low);
    lVar1 = (long)cVar2 * 2;
    piVar3 = primesum::Wheel::next + lVar1 + 1;
  }
  w->next_multiple = lVar4;
  w->wheel_index = cVar2;
  return;
}

Assistant:

void cross_off(BitSieve& sieve,
               int64_t low,
               int64_t high,
               int64_t prime,
               WheelItem& w)
{
  int64_t m = w.next_multiple;
  int64_t wheel_index = w.wheel_index;

  for (; m < high; m += prime * Wheel::next_multiple_factor(&wheel_index))
    sieve.unset(m - low);

  w.set(m, wheel_index);
}